

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

QTreeWidgetItem * __thiscall QTreeWidget::itemBelow(QTreeWidget *this,QTreeWidgetItem *item)

{
  QTreeWidgetPrivate *this_00;
  QTreeModel *pQVar1;
  QTreeWidgetItem *pQVar2;
  long in_FS_OFFSET;
  undefined1 *local_68;
  undefined1 *puStack_60;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_58;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeWidgetPrivate **)
             &(this->super_QTreeView).super_QAbstractItemView.super_QAbstractScrollArea.super_QFrame
              .super_QWidget.field_0x8;
  pQVar1 = QTreeWidgetPrivate::treeModel(this_00);
  if (pQVar1->headerItem == item) {
    pQVar2 = (QTreeWidgetItem *)0x0;
  }
  else {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QTreeWidgetPrivate::index((QTreeWidgetPrivate *)&local_48,(char *)this_00,(int)item);
    local_58.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    QTreeView::indexBelow((QModelIndex *)&local_68,&this->super_QTreeView,(QModelIndex *)&local_48);
    pQVar2 = QTreeWidgetPrivate::item(this_00,(QModelIndex *)&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QTreeWidgetItem *QTreeWidget::itemBelow(const QTreeWidgetItem *item) const
{
    Q_D(const QTreeWidget);
    if (item == d->treeModel()->headerItem)
        return nullptr;
    const QModelIndex index = d->index(item);
    const QModelIndex below = indexBelow(index);
    return d->item(below);
}